

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int isSpace(int c)

{
  int local_c;
  int c_local;
  
  if (((c - 9U < 2) || (c == 0xd)) || (c == 0x20)) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static
int isSpace(int c)
{
  switch (c) {
  case 0x20:
  case 0xD:
  case 0xA:
  case 0x9:     
    return 1;
  }
  return 0;
}